

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O2

void __thiscall
clipp::group::child_t<clipp::parameter,_clipp::group>::child_t
          (child_t<clipp::parameter,_clipp::group> *this,
          child_t<clipp::parameter,_clipp::group> *src)

{
  type tVar1;
  pointer pfVar2;
  
  tVar1 = src->type_;
  this->type_ = tVar1;
  if (tVar1 != group) {
    parameter::parameter((parameter *)this,(parameter *)src);
    return;
  }
  detail::token<clipp::group>::token((token<clipp::group> *)this,(token<clipp::group> *)src);
  pfVar2 = (src->m_).param.super_action_provider<clipp::parameter>.argActions_.
           super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->m_).param.super_action_provider<clipp::parameter>.argActions_.
  super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (src->m_).param.super_action_provider<clipp::parameter>.argActions_.
       super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->m_).param.super_action_provider<clipp::parameter>.argActions_.
  super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pfVar2;
  (this->m_).param.super_action_provider<clipp::parameter>.argActions_.
  super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (src->m_).param.super_action_provider<clipp::parameter>.argActions_.
       super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (src->m_).param.super_action_provider<clipp::parameter>.argActions_.
  super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (src->m_).param.super_action_provider<clipp::parameter>.argActions_.
  super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (src->m_).param.super_action_provider<clipp::parameter>.argActions_.
  super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_).group.scoped_ = (src->m_).group.scoped_;
  *(undefined2 *)((long)&this->m_ + 0x40) = *(undefined2 *)((long)&src->m_ + 0x40);
  return;
}

Assistant:

child_t(child_t&& src) noexcept : type_{src.type_} {
            switch(type_) {
                default:
                case type::param: new(&m_)data{std::move(src.m_.param)}; break;
                case type::group: new(&m_)data{std::move(src.m_.group)}; break;
            }
        }